

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall mjs::object::put(object *this,string *name,value *val,property_attribute attr)

{
  uint32_t uVar1;
  bool bVar2;
  undefined4 in_EAX;
  property *ppVar3;
  object *this_00;
  gc_vector<mjs::object::property> *this_01;
  wstring_view wVar4;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> pVar5;
  gc_heap_ptr_untracked<mjs::object,_true> local_38;
  property_attribute attr_local;
  
  _local_38 = CONCAT44(attr,in_EAX);
  wVar4 = string::view(name);
  pVar5 = find(this,wVar4);
  ppVar3 = pVar5.first;
  this_00 = this;
  if (ppVar3 == (property *)0x0) {
    do {
      uVar1 = (this_00->prototype_).pos_;
      _local_38 = CONCAT44(attr_local,uVar1);
      if (uVar1 == 0) goto LAB_0014504e;
      this_00 = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&local_38,this->heap_);
      wVar4 = string::view(name);
      pVar5 = find(this_00,wVar4);
      ppVar3 = pVar5.first;
    } while (ppVar3 == (property *)0x0);
    bVar2 = has_attributes(ppVar3->attributes_,accessor);
    if (bVar2) {
      property::put(ppVar3,this,val);
    }
    else {
LAB_0014504e:
      if (this->extensible_ == true) {
        this_01 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                            (&this->properties_,this->heap_);
        gc_vector<mjs::object::property>::
        emplace_back<mjs::string_const&,mjs::value_const&,mjs::property_attribute&>
                  (this_01,name,val,&attr_local);
      }
    }
  }
  else {
    bVar2 = has_attributes(ppVar3->attributes_,read_only);
    if (!bVar2) {
      property::put(ppVar3,this,val);
      return;
    }
  }
  return;
}

Assistant:

void object::put(const string& name, const value& val, property_attribute attr) {
    //ES5.1, 8.12.5

    // See if there is already a property with this name
    if (auto it = find(name.view()).first; it) {
        if (has_attributes(it->attributes(), property_attribute::read_only)) {
            return;
        }
        it->put(*this, val);
        return;
    }

    // Check if there is an accessor property in a prototype
    for (auto p = prototype_; p; ) {
        auto& proto = p.dereference(heap());
        if (auto it = proto.find(name.view()).first) {
            if (has_attributes(it->attributes(), property_attribute::accessor)) {
                it->put(*this, val);
                return;
            }
            // Handle as insertion
            break;
        }
        p = proto.prototype_;
    }

    // Normal insertion
    if (extensible_) {
        properties_.dereference(heap()).emplace_back(name, val, attr);
    }
}